

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
          (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *this,size_t count,
          float *value,polymorphic_allocator<float> *alloc)

{
  iterator pfVar1;
  undefined8 *in_RCX;
  float *in_RDX;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  size_t i;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *local_28;
  
  (in_RDI->alloc).memoryResource = (memory_resource *)*in_RCX;
  in_RDI->ptr = (float *)0x0;
  in_RDI->nAlloc = 0;
  in_RDI->nStored = 0;
  reserve(in_RSI,(size_t)in_RDX);
  for (local_28 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
      local_28 < in_RSI;
      local_28 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                 ((long)&(local_28->alloc).memoryResource + 1)) {
    pfVar1 = begin(in_RDI);
    pstd::pmr::polymorphic_allocator<float>::construct<float,float_const&>
              (&in_RDI->alloc,pfVar1 + (long)local_28,in_RDX);
  }
  in_RDI->nStored = (size_t)in_RSI;
  return;
}

Assistant:

InlinedVector(size_t count, const T &value, const Allocator &alloc = {})
        : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(begin() + i, value);
        nStored = count;
    }